

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::Recycle
          (VulkanSyncObjectManager *this,VkFenceType vkFence,bool IsUnsignaled)

{
  pointer *pppVVar1;
  iterator __position;
  int iVar2;
  undefined7 in_register_00000011;
  VkFence_T *local_18;
  
  local_18 = vkFence.Value;
  if ((int)CONCAT71(in_register_00000011,IsUnsignaled) == 0) {
    (*vkResetFences)(this->m_LogicalDevice->m_VkDevice,1,&local_18);
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_FencePoolGuard);
  if (iVar2 == 0) {
    __position._M_current =
         (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<VkFence_T*,std::allocator<VkFence_T*>>::_M_realloc_insert<VkFence_T*const&>
                ((vector<VkFence_T*,std::allocator<VkFence_T*>> *)&this->m_FencePool,__position,
                 &local_18);
    }
    else {
      *__position._M_current = local_18;
      pppVVar1 = &(this->m_FencePool).super__Vector_base<VkFence_T_*,_std::allocator<VkFence_T_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_FencePoolGuard);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void VulkanSyncObjectManager::Recycle(VkFenceType vkFence, bool IsUnsignaled)
{
    if (!IsUnsignaled)
    {
        // Access to vkFence must be externally synchronized, we assume that vkFence is not used anywhere else.
        vkResetFences(m_LogicalDevice.GetVkDevice(), 1, &vkFence.Value);
    }

    std::lock_guard<std::mutex> Lock{m_FencePoolGuard};
    m_FencePool.push_back(vkFence.Value);
}